

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

void lodepng_color_stats_init(LodePNGColorStats *stats)

{
  LodePNGColorStats *stats_local;
  
  stats->colored = 0;
  stats->key = 0;
  stats->key_b = 0;
  stats->key_g = 0;
  stats->key_r = 0;
  stats->alpha = 0;
  stats->numcolors = 0;
  stats->bits = 1;
  stats->numpixels = 0;
  stats->allow_palette = 1;
  stats->allow_greyscale = 1;
  return;
}

Assistant:

void lodepng_color_stats_init(LodePNGColorStats* stats) {
  /*stats*/
  stats->colored = 0;
  stats->key = 0;
  stats->key_r = stats->key_g = stats->key_b = 0;
  stats->alpha = 0;
  stats->numcolors = 0;
  stats->bits = 1;
  stats->numpixels = 0;
  /*settings*/
  stats->allow_palette = 1;
  stats->allow_greyscale = 1;
}